

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::ImmQ_complete(ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *qimm)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = qimm->m_data[0];
  __return_storage_ptr__->m_data[1] = qimm->m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = qimm->m_data[1];
  __return_storage_ptr__->m_data[2] = qimm->m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = qimm->m_data[2];
  __return_storage_ptr__->m_data[3] = qimm->m_data[2];
  auVar2 = vfnmadd213sd_fma(auVar2,auVar2,ZEXT816(0x3ff0000000000000));
  auVar2 = vfnmadd231sd_fma(auVar2,auVar3,auVar3);
  auVar2 = vfnmadd231sd_fma(auVar2,auVar4,auVar4);
  if (auVar2._0_8_ < 0.0) {
    dVar1 = sqrt(auVar2._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar1 = auVar2._0_8_;
  }
  __return_storage_ptr__->m_data[0] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> ImmQ_complete(const ChVector<double>& qimm) {
    ChQuaternion<double> mq;
    mq.e1() = qimm.x();
    mq.e2() = qimm.y();
    mq.e3() = qimm.z();
    mq.e0() = sqrt(1 - mq.e1() * mq.e1() - mq.e2() * mq.e2() - mq.e3() * mq.e3());
    return mq;
}